

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  _InputArray local_5d0;
  allocator<char> local_5b1;
  string local_5b0 [39];
  allocator<char> local_589;
  string local_588 [32];
  vector<int,_std::allocator<int>_> local_568;
  _InputArray local_550;
  string local_538 [32];
  stringstream local_518 [8];
  stringstream out1;
  ostream local_508 [376];
  MatExpr local_390 [352];
  MatExpr local_230 [8];
  Mat naive_disparities;
  int local_1d0 [2];
  int local_1c8;
  MatSize local_1c4 [4];
  int width;
  int local_1bc;
  undefined4 local_1b8;
  int height;
  undefined1 local_1b0 [8];
  string output2_file;
  undefined1 local_188 [8];
  string output_file;
  string local_160 [32];
  string local_140 [8];
  Mat image2;
  long local_130;
  allocator<char> local_c9;
  string local_c8 [32];
  string local_a8 [8];
  Mat image1;
  long local_98;
  double dStack_40;
  int x;
  double scale;
  double weight;
  int window_size;
  int dmin;
  double baseline;
  double focal_length;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  baseline = 1247.0;
  _window_size = 213.0;
  weight._4_4_ = 0x43;
  weight._0_4_ = 3;
  scale = 500.0;
  dStack_40 = 3.0;
  focal_length = (double)argv;
  argv_local._0_4_ = argc;
  if (argc < 4) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)focal_length);
    poVar2 = std::operator<<(poVar2," IMAGE1 IMAGE2 OUTPUT_FILE OUTPUT_FILE2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,pcVar1,&local_c9);
    cv::imread(local_a8,(int)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pcVar1 = *(char **)((long)focal_length + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_160,pcVar1,(allocator<char> *)(output_file.field_2._M_local_buf + 0xf));
    cv::imread(local_140,(int)local_160);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)(output_file.field_2._M_local_buf + 0xf));
    pcVar1 = *(char **)((long)focal_length + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,pcVar1,
               (allocator<char> *)(output2_file.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(output2_file.field_2._M_local_buf + 0xf));
    pcVar1 = *(char **)((long)focal_length + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,pcVar1,(allocator<char> *)((long)&height + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&height + 3));
    if (local_98 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"No image1 data");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      local_1b8 = 1;
    }
    else if (local_130 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"No image2 data");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      local_1b8 = 1;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "------------------ Parameters -------------------");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"focal_length = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,1247.0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"baseline = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,213.0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"window_size = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"occlusion weights = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,500.0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"disparity added due to image cropping = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x43);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"scaling of disparity images to show = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3.0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"output filename = ");
      poVar2 = std::operator<<(poVar2,*(char **)((long)focal_length + 0x18));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      cv::MatSize::operator()(local_1c4);
      local_1bc = width;
      cv::MatSize::operator()((MatSize *)local_1d0);
      local_1c8 = local_1d0[0];
      cv::Mat::zeros((int)local_390,local_1bc,local_1d0[0]);
      cv::MatExpr::operator_cast_to_Mat(local_230);
      cv::MatExpr::~MatExpr(local_390);
      StereoEstimation_Naive
                ((int *)&weight,(int *)((long)&weight + 4),local_1bc,local_1c8,(Mat *)local_a8,
                 (Mat *)local_140,(Mat *)local_230,&stack0xffffffffffffffc0);
      Disparity2PointCloud
                ((string *)local_188,local_1bc,local_1c8,(Mat *)local_230,(int *)&weight,
                 (int *)((long)&weight + 4),(double *)&window_size,&baseline);
      std::__cxx11::stringstream::stringstream(local_518);
      poVar2 = std::operator<<(local_508,(string *)local_188);
      std::operator<<(poVar2,"_naive.png");
      std::__cxx11::stringstream::str();
      cv::_InputArray::_InputArray(&local_550,(Mat *)local_230);
      local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_568);
      cv::imwrite(local_538,&local_550,(vector *)&local_568);
      std::vector<int,_std::allocator<int>_>::~vector(&local_568);
      cv::_InputArray::~_InputArray(&local_550);
      std::__cxx11::string::~string(local_538);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_588,"Naive",&local_589);
      cv::namedWindow(local_588,1);
      std::__cxx11::string::~string(local_588);
      std::allocator<char>::~allocator(&local_589);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_5b0,"Naive",&local_5b1);
      cv::_InputArray::_InputArray(&local_5d0,(Mat *)local_230);
      cv::imshow(local_5b0,&local_5d0);
      cv::_InputArray::~_InputArray(&local_5d0);
      std::__cxx11::string::~string(local_5b0);
      std::allocator<char>::~allocator(&local_5b1);
      StereoEstimation_Dynamic
                ((int *)&weight,local_1bc,local_1c8,(Mat *)local_a8,(Mat *)local_140,&scale,
                 (string *)local_1b0);
      cv::waitKey(0);
      argv_local._4_4_ = 0;
      local_1b8 = 1;
      std::__cxx11::stringstream::~stringstream(local_518);
      cv::Mat::~Mat((Mat *)local_230);
    }
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)local_188);
    cv::Mat::~Mat((Mat *)local_140);
    cv::Mat::~Mat((Mat *)local_a8);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {

  ////////////////
  // Parameters //
  ////////////////

  // camera setup parameters
  const double focal_length = 1247;
  const double baseline = 213;

  // stereo estimation parameters
  const int dmin = 67;
  const int window_size = 3;
  const double weight = 500;
  const double scale = 3;

  ///////////////////////////
  // Commandline arguments //
  ///////////////////////////
  int x = argc;
  if (argc < 4) {
    std::cerr << "Usage: " << argv[0] << " IMAGE1 IMAGE2 OUTPUT_FILE OUTPUT_FILE2" << std::endl;
    return 1;
  }

  cv::Mat image1 = cv::imread(argv[1], cv::IMREAD_GRAYSCALE);
  cv::Mat image2 = cv::imread(argv[2], cv::IMREAD_GRAYSCALE);
  const std::string output_file = argv[3];
  const std::string output2_file = argv[4];

  if (!image1.data) {
    std::cerr << "No image1 data" << std::endl;
    return EXIT_FAILURE;
  }

  if (!image2.data) {
    std::cerr << "No image2 data" << std::endl;
    return EXIT_FAILURE;
  }

  std::cout << "------------------ Parameters -------------------" << std::endl;
  std::cout << "focal_length = " << focal_length << std::endl;
  std::cout << "baseline = " << baseline << std::endl;
  std::cout << "window_size = " << window_size << std::endl;
  std::cout << "occlusion weights = " << weight << std::endl;
  std::cout << "disparity added due to image cropping = " << dmin << std::endl;
  std::cout << "scaling of disparity images to show = " << scale << std::endl;
  std::cout << "output filename = " << argv[3] << std::endl;
  std::cout << "-------------------------------------------------" << std::endl;

   int height = image1.size().height;
   int width = image1.size().width;

  ////////////////////
  // Reconstruction //
  ////////////////////

  // Naive disparity image
 
  cv::Mat naive_disparities = cv::Mat::zeros(height, width, CV_8UC1);
  

  StereoEstimation_Naive(
    window_size, dmin, height, width,
    image1, image2,
    naive_disparities, scale);

  ////////////
  // Output //
  ////////////

  // reconstruction
  Disparity2PointCloud(
    output_file,
    height, width, naive_disparities,
    window_size, dmin, baseline, focal_length);

  // save / display images
  std::stringstream out1;
  out1 << output_file << "_naive.png";
  cv::imwrite(out1.str(), naive_disparities);

  cv::namedWindow("Naive", cv::WINDOW_AUTOSIZE);
  cv::imshow("Naive", naive_disparities);

  // Dynamic disparity image
  StereoEstimation_Dynamic(
      window_size,
      height,
      width,
      image1, image2, weight, output2_file); // disparity image is decalred in the function


  cv::waitKey(0);

  return 0;
}